

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::EnhancedLayouts::Utils::ProgramInterface::GetInterfaceForStage_abi_cxx11_
          (string *__return_storage_ptr__,ProgramInterface *this,STAGES stage)

{
  GLchar *pGVar1;
  string local_138;
  string *local_118;
  string *ssbs;
  string **local_f0;
  string *uniforms;
  string **local_c8;
  string *outputs;
  string **local_a0;
  string *inputs;
  string **local_78;
  string *globals;
  string **local_50;
  string *structures;
  ShaderInterface *si;
  allocator<char> local_2a;
  byte local_29;
  size_t local_28;
  size_t position;
  ProgramInterface *pPStack_18;
  STAGES stage_local;
  ProgramInterface *this_local;
  string *interface;
  
  local_28 = 0;
  local_29 = 0;
  position._4_4_ = stage;
  pPStack_18 = this;
  this_local = (ProgramInterface *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "/* Globals */\nGLOBALS\n\n/* Structures */\nSTRUCTURES\n\n/* Uniforms */\nUNIFORMS\n\n/* Inputs */\nINPUTS\n\n/* Outputs */\nOUTPUTS\n\n/* Storage */\nSTORAGE\n"
             ,&local_2a);
  std::allocator<char>::~allocator(&local_2a);
  structures = &GetShaderInterface(this,position._4_4_)->m_globals;
  GetDefinitionsStructures_abi_cxx11_((string *)&globals,this);
  local_50 = &globals;
  ShaderInterface::GetDefinitionsGlobals_abi_cxx11_((string *)&inputs,(ShaderInterface *)structures)
  ;
  local_78 = &inputs;
  ShaderInterface::GetDefinitionsInputs_abi_cxx11_((string *)&outputs,(ShaderInterface *)structures)
  ;
  local_a0 = &outputs;
  ShaderInterface::GetDefinitionsOutputs_abi_cxx11_
            ((string *)&uniforms,(ShaderInterface *)structures);
  local_c8 = &uniforms;
  ShaderInterface::GetDefinitionsUniforms_abi_cxx11_((string *)&ssbs,(ShaderInterface *)structures);
  local_f0 = &ssbs;
  ShaderInterface::GetDefinitionsSSBs_abi_cxx11_(&local_138,(ShaderInterface *)structures);
  local_118 = &local_138;
  pGVar1 = (GLchar *)std::__cxx11::string::c_str();
  replaceToken("GLOBALS",&local_28,pGVar1,__return_storage_ptr__);
  pGVar1 = (GLchar *)std::__cxx11::string::c_str();
  replaceToken("STRUCTURES",&local_28,pGVar1,__return_storage_ptr__);
  pGVar1 = (GLchar *)std::__cxx11::string::c_str();
  replaceToken("UNIFORMS",&local_28,pGVar1,__return_storage_ptr__);
  pGVar1 = (GLchar *)std::__cxx11::string::c_str();
  replaceToken("INPUTS",&local_28,pGVar1,__return_storage_ptr__);
  pGVar1 = (GLchar *)std::__cxx11::string::c_str();
  replaceToken("OUTPUTS",&local_28,pGVar1,__return_storage_ptr__);
  pGVar1 = (GLchar *)std::__cxx11::string::c_str();
  replaceToken("STORAGE",&local_28,pGVar1,__return_storage_ptr__);
  local_29 = 1;
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&ssbs);
  std::__cxx11::string::~string((string *)&uniforms);
  std::__cxx11::string::~string((string *)&outputs);
  std::__cxx11::string::~string((string *)&inputs);
  std::__cxx11::string::~string((string *)&globals);
  if ((local_29 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ProgramInterface::GetInterfaceForStage(Shader::STAGES stage) const
{
	size_t		position  = 0;
	std::string interface = "/* Globals */\n"
							"GLOBALS\n"
							"\n"
							"/* Structures */\n"
							"STRUCTURES\n"
							"\n"
							"/* Uniforms */\n"
							"UNIFORMS\n"
							"\n"
							"/* Inputs */\n"
							"INPUTS\n"
							"\n"
							"/* Outputs */\n"
							"OUTPUTS\n"
							"\n"
							"/* Storage */\n"
							"STORAGE\n";

	const ShaderInterface& si = GetShaderInterface(stage);

	const std::string& structures = GetDefinitionsStructures();

	const std::string& globals  = si.GetDefinitionsGlobals();
	const std::string& inputs   = si.GetDefinitionsInputs();
	const std::string& outputs  = si.GetDefinitionsOutputs();
	const std::string& uniforms = si.GetDefinitionsUniforms();
	const std::string& ssbs		= si.GetDefinitionsSSBs();

	replaceToken("GLOBALS", position, globals.c_str(), interface);
	replaceToken("STRUCTURES", position, structures.c_str(), interface);
	replaceToken("UNIFORMS", position, uniforms.c_str(), interface);
	replaceToken("INPUTS", position, inputs.c_str(), interface);
	replaceToken("OUTPUTS", position, outputs.c_str(), interface);
	replaceToken("STORAGE", position, ssbs.c_str(), interface);

	return interface;
}